

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_uint64 ma_dr_wav__read_cue_to_metadata_obj
                    (ma_dr_wav__metadata_parser *pParser,ma_dr_wav_chunk_header *pChunkHeader,
                    ma_dr_wav_metadata *pMetadata)

{
  size_t bytesRead;
  size_t sVar1;
  size_t sVar2;
  ma_uint32 iCuePoint;
  ulong uVar3;
  long lVar4;
  ma_uint8 *pmVar5;
  ma_uint8 cueHeaderSectionData [4];
  ma_uint8 cuePointData [24];
  uint local_4c;
  undefined4 local_48;
  undefined4 local_44;
  ma_uint8 local_40;
  ma_uint8 local_3f;
  ma_uint8 local_3e;
  ma_uint8 local_3d;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  if (pMetadata == (ma_dr_wav_metadata *)0x0) {
    sVar1 = 0;
  }
  else {
    sVar1 = (*pParser->onRead)(pParser->pReadSeekUserData,&local_4c,4);
    if (sVar1 == 4) {
      pMetadata->type = ma_dr_wav_metadata_type_cue;
      (pMetadata->data).cue.cuePointCount = local_4c;
      if ((pChunkHeader->sizeInBytes - 4) / 0x18 == (ulong)local_4c) {
        uVar3 = (ulong)((uint)pParser->pDataCursor & 7);
        lVar4 = 8 - uVar3;
        if (uVar3 == 0) {
          lVar4 = 0;
        }
        pmVar5 = pParser->pDataCursor + lVar4;
        pParser->pDataCursor = pmVar5 + (ulong)local_4c * 0x18;
        (pMetadata->data).bext.pOriginatorName = (char *)pmVar5;
        sVar1 = 4;
        if ((pMetadata->data).cue.cuePointCount != 0) {
          lVar4 = 0;
          uVar3 = 0;
          do {
            sVar2 = (*pParser->onRead)(pParser->pReadSeekUserData,&local_48,0x18);
            sVar1 = sVar1 + sVar2;
            if (sVar2 != 0x18) {
              return sVar1;
            }
            *(undefined4 *)(((pMetadata->data).cue.pCuePoints)->dataChunkId + lVar4 + -8) = local_48
            ;
            *(undefined4 *)(((pMetadata->data).cue.pCuePoints)->dataChunkId + lVar4 + -4) = local_44
            ;
            ((pMetadata->data).cue.pCuePoints)->dataChunkId[lVar4] = local_40;
            ((pMetadata->data).cue.pCuePoints)->dataChunkId[lVar4 + 1] = local_3f;
            ((pMetadata->data).cue.pCuePoints)->dataChunkId[lVar4 + 2] = local_3e;
            ((pMetadata->data).cue.pCuePoints)->dataChunkId[lVar4 + 3] = local_3d;
            *(undefined4 *)(((pMetadata->data).cue.pCuePoints)->dataChunkId + lVar4 + 4) = local_3c;
            *(undefined4 *)(((pMetadata->data).cue.pCuePoints)->dataChunkId + lVar4 + 8) = local_38;
            *(undefined4 *)(((pMetadata->data).cue.pCuePoints)->dataChunkId + lVar4 + 0xc) =
                 local_34;
            uVar3 = uVar3 + 1;
            lVar4 = lVar4 + 0x18;
          } while (uVar3 < (pMetadata->data).cue.cuePointCount);
        }
      }
      else {
        sVar1 = 4;
      }
    }
  }
  return sVar1;
}

Assistant:

MA_PRIVATE ma_uint64 ma_dr_wav__read_cue_to_metadata_obj(ma_dr_wav__metadata_parser* pParser, const ma_dr_wav_chunk_header* pChunkHeader, ma_dr_wav_metadata* pMetadata)
{
    ma_uint8 cueHeaderSectionData[MA_DR_WAV_CUE_BYTES];
    ma_uint64 totalBytesRead = 0;
    size_t bytesJustRead;
    if (pMetadata == NULL) {
        return 0;
    }
    bytesJustRead = ma_dr_wav__metadata_parser_read(pParser, cueHeaderSectionData, sizeof(cueHeaderSectionData), &totalBytesRead);
    MA_DR_WAV_ASSERT(pParser->stage == ma_dr_wav__metadata_parser_stage_read);
    if (bytesJustRead == sizeof(cueHeaderSectionData)) {
        pMetadata->type                   = ma_dr_wav_metadata_type_cue;
        pMetadata->data.cue.cuePointCount = ma_dr_wav_bytes_to_u32(cueHeaderSectionData);
        if (pMetadata->data.cue.cuePointCount == (pChunkHeader->sizeInBytes - MA_DR_WAV_CUE_BYTES) / MA_DR_WAV_CUE_POINT_BYTES) {
            pMetadata->data.cue.pCuePoints    = (ma_dr_wav_cue_point*)ma_dr_wav__metadata_get_memory(pParser, sizeof(ma_dr_wav_cue_point) * pMetadata->data.cue.cuePointCount, MA_DR_WAV_METADATA_ALIGNMENT);
            MA_DR_WAV_ASSERT(pMetadata->data.cue.pCuePoints != NULL);
            if (pMetadata->data.cue.cuePointCount > 0) {
                ma_uint32 iCuePoint;
                for (iCuePoint = 0; iCuePoint < pMetadata->data.cue.cuePointCount; ++iCuePoint) {
                    ma_uint8 cuePointData[MA_DR_WAV_CUE_POINT_BYTES];
                    bytesJustRead = ma_dr_wav__metadata_parser_read(pParser, cuePointData, sizeof(cuePointData), &totalBytesRead);
                    if (bytesJustRead == sizeof(cuePointData)) {
                        pMetadata->data.cue.pCuePoints[iCuePoint].id                = ma_dr_wav_bytes_to_u32(cuePointData + 0);
                        pMetadata->data.cue.pCuePoints[iCuePoint].playOrderPosition = ma_dr_wav_bytes_to_u32(cuePointData + 4);
                        pMetadata->data.cue.pCuePoints[iCuePoint].dataChunkId[0]    = cuePointData[8];
                        pMetadata->data.cue.pCuePoints[iCuePoint].dataChunkId[1]    = cuePointData[9];
                        pMetadata->data.cue.pCuePoints[iCuePoint].dataChunkId[2]    = cuePointData[10];
                        pMetadata->data.cue.pCuePoints[iCuePoint].dataChunkId[3]    = cuePointData[11];
                        pMetadata->data.cue.pCuePoints[iCuePoint].chunkStart        = ma_dr_wav_bytes_to_u32(cuePointData + 12);
                        pMetadata->data.cue.pCuePoints[iCuePoint].blockStart        = ma_dr_wav_bytes_to_u32(cuePointData + 16);
                        pMetadata->data.cue.pCuePoints[iCuePoint].sampleByteOffset  = ma_dr_wav_bytes_to_u32(cuePointData + 20);
                    } else {
                        break;
                    }
                }
            }
        }
    }
    return totalBytesRead;
}